

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_object.h
# Opt level: O0

void __thiscall
booster::shared_object::
symbol<cppcms::sessions::session_storage_factory*(*)(cppcms::json::value_const&)>
          (shared_object *this,_func_session_storage_factory_ptr_value_ptr **s,string *name)

{
  long lVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  void *p;
  string *in_stack_ffffffffffffffb8;
  runtime_error *in_stack_ffffffffffffffc0;
  
  lVar1 = booster::shared_object::resolve_symbol(in_RDI);
  if (lVar1 == 0) {
    uVar2 = __cxa_allocate_exception(0x30);
    std::operator+((char *)in_RDI,in_RSI);
    runtime_error::runtime_error(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    __cxa_throw(uVar2,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  *(long *)in_RSI = lVar1;
  return;
}

Assistant:

void symbol(T &s,std::string const &name) const
		{
			void *p = resolve_symbol(name);
			if(!p) {
				throw booster::runtime_error("booster::shared_object:failed to resolve symbol:" + name);
			}
			s = reinterpret_cast<T>(reinterpret_cast<size_t>(p));
		}